

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

void __thiscall
cmLinkLineComputer::ComputeLinkLibraries
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,string *stdLibString,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  size_type sVar1;
  ostream *poVar2;
  string_view str;
  string remainingLibs;
  string rpath_link;
  string rpath;
  ostringstream fout;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300 [6];
  ios_base local_2a0 [264];
  ostringstream rpathOut;
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&rpathOut);
  ComputeRPath_abi_cxx11_((string *)&fout,this,cli);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&rpathOut,_fout,local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_fout != local_300) {
    operator_delete(_fout,local_300[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  if (rpath._M_string_length != 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkLibraries,&rpath);
  }
  ComputeLinkLibs(this,cli,linkLibraries);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&rpath_link,cli);
  sVar1 = (cli->RPathLinkFlag)._M_string_length;
  if ((sVar1 != 0) && (rpath_link._M_string_length != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fout,(cli->RPathLinkFlag)._M_dataplus._M_p,sVar1);
    str._M_str = rpath_link._M_dataplus._M_p;
    str._M_len = rpath_link._M_string_length;
    cmOutputConverter::EscapeForShell_abi_cxx11_
              (&remainingLibs,this->OutputConverter,str,(bool)(this->ForResponse ^ 1),false,false,
               false,false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fout,remainingLibs._M_dataplus._M_p,remainingLibs._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)remainingLibs._M_dataplus._M_p != &remainingLibs.field_2) {
      operator_delete(remainingLibs._M_dataplus._M_p,remainingLibs.field_2._M_allocated_capacity + 1
                     );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fout," ",1);
  }
  if (stdLibString->_M_string_length != 0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&fout,(stdLibString->_M_dataplus)._M_p,
                        stdLibString->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::__cxx11::stringbuf::str();
  if (remainingLibs._M_string_length != 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkLibraries,&remainingLibs);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)remainingLibs._M_dataplus._M_p != &remainingLibs.field_2) {
    operator_delete(remainingLibs._M_dataplus._M_p,remainingLibs.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rpath_link._M_dataplus._M_p != &rpath_link.field_2) {
    operator_delete(rpath_link._M_dataplus._M_p,rpath_link.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
  std::ios_base::~ios_base(local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rpath._M_dataplus._M_p != &rpath.field_2) {
    operator_delete(rpath._M_dataplus._M_p,rpath.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rpathOut);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void cmLinkLineComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString,
  std::vector<BT<std::string>>& linkLibraries)
{
  std::ostringstream rpathOut;
  rpathOut << this->ComputeRPath(cli);

  std::string rpath = rpathOut.str();
  if (!rpath.empty()) {
    linkLibraries.emplace_back(std::move(rpath));
  }

  // Write the library flags to the build rule.
  this->ComputeLinkLibs(cli, linkLibraries);

  // Add the linker runtime search path if any.
  std::ostringstream fout;
  std::string rpath_link = cli.GetRPathLinkString();
  if (!cli.GetRPathLinkFlag().empty() && !rpath_link.empty()) {
    fout << cli.GetRPathLinkFlag();
    fout << this->OutputConverter->EscapeForShell(rpath_link,
                                                  !this->ForResponse);
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  std::string remainingLibs = fout.str();
  if (!remainingLibs.empty()) {
    linkLibraries.emplace_back(remainingLibs);
  }
}